

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetResourceStateFlagString(RESOURCE_STATE State)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  RESOURCE_STATE State_local;
  
  msg.field_2._12_4_ = State;
  if (State != RESOURCE_STATE_UNKNOWN) {
    bVar1 = IsPowerOfTwo<Diligent::RESOURCE_STATE>(State);
    if (!bVar1) {
      FormatString<char[25]>((string *)local_38,(char (*) [25])"Single state is expected");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetResourceStateFlagString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x57b);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  if (msg.field_2._12_4_ == 0) {
    pcStack_10 = "UNKNOWN";
  }
  else if (msg.field_2._12_4_ == 1) {
    pcStack_10 = "UNDEFINED";
  }
  else if (msg.field_2._12_4_ == 2) {
    pcStack_10 = "VERTEX_BUFFER";
  }
  else if (msg.field_2._12_4_ == 4) {
    pcStack_10 = "CONSTANT_BUFFER";
  }
  else if (msg.field_2._12_4_ == 8) {
    pcStack_10 = "INDEX_BUFFER";
  }
  else if (msg.field_2._12_4_ == 0x10) {
    pcStack_10 = "RENDER_TARGET";
  }
  else if (msg.field_2._12_4_ == 0x20) {
    pcStack_10 = "UNORDERED_ACCESS";
  }
  else if (msg.field_2._12_4_ == 0x40) {
    pcStack_10 = "DEPTH_WRITE";
  }
  else if (msg.field_2._12_4_ == 0x80) {
    pcStack_10 = "DEPTH_READ";
  }
  else if (msg.field_2._12_4_ == 0x100) {
    pcStack_10 = "SHADER_RESOURCE";
  }
  else if (msg.field_2._12_4_ == 0x200) {
    pcStack_10 = "STREAM_OUT";
  }
  else if (msg.field_2._12_4_ == 0x400) {
    pcStack_10 = "INDIRECT_ARGUMENT";
  }
  else if (msg.field_2._12_4_ == 0x800) {
    pcStack_10 = "COPY_DEST";
  }
  else if (msg.field_2._12_4_ == 0x1000) {
    pcStack_10 = "COPY_SOURCE";
  }
  else if (msg.field_2._12_4_ == 0x2000) {
    pcStack_10 = "RESOLVE_DEST";
  }
  else if (msg.field_2._12_4_ == 0x4000) {
    pcStack_10 = "RESOLVE_SOURCE";
  }
  else if (msg.field_2._12_4_ == 0x8000) {
    pcStack_10 = "INPUT_ATTACHMENT";
  }
  else if (msg.field_2._12_4_ == 0x10000) {
    pcStack_10 = "PRESENT";
  }
  else if (msg.field_2._12_4_ == 0x20000) {
    pcStack_10 = "BUILD_AS_READ";
  }
  else if (msg.field_2._12_4_ == 0x40000) {
    pcStack_10 = "BUILD_AS_WRITE";
  }
  else if (msg.field_2._12_4_ == 0x80000) {
    pcStack_10 = "RAY_TRACING";
  }
  else if (msg.field_2._12_4_ == 0x100000) {
    pcStack_10 = "COMMON";
  }
  else if (msg.field_2._12_4_ == 0x200000) {
    pcStack_10 = "SHADING_RATE";
  }
  else {
    FormatString<char[23]>((string *)local_68,(char (*) [23])"Unknown resource state");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetResourceStateFlagString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x599);
    std::__cxx11::string::~string((string *)local_68);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetResourceStateFlagString(RESOURCE_STATE State)
{
    VERIFY(State == RESOURCE_STATE_UNKNOWN || IsPowerOfTwo(State), "Single state is expected");
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update this function to handle the new resource state");
    switch (State)
    {
        // clang-format off
        case RESOURCE_STATE_UNKNOWN:           return "UNKNOWN";
        case RESOURCE_STATE_UNDEFINED:         return "UNDEFINED";
        case RESOURCE_STATE_VERTEX_BUFFER:     return "VERTEX_BUFFER";
        case RESOURCE_STATE_CONSTANT_BUFFER:   return "CONSTANT_BUFFER";
        case RESOURCE_STATE_INDEX_BUFFER:      return "INDEX_BUFFER";
        case RESOURCE_STATE_RENDER_TARGET:     return "RENDER_TARGET";
        case RESOURCE_STATE_UNORDERED_ACCESS:  return "UNORDERED_ACCESS";
        case RESOURCE_STATE_DEPTH_WRITE:       return "DEPTH_WRITE";
        case RESOURCE_STATE_DEPTH_READ:        return "DEPTH_READ";
        case RESOURCE_STATE_SHADER_RESOURCE:   return "SHADER_RESOURCE";
        case RESOURCE_STATE_STREAM_OUT:        return "STREAM_OUT";
        case RESOURCE_STATE_INDIRECT_ARGUMENT: return "INDIRECT_ARGUMENT";
        case RESOURCE_STATE_COPY_DEST:         return "COPY_DEST";
        case RESOURCE_STATE_COPY_SOURCE:       return "COPY_SOURCE";
        case RESOURCE_STATE_RESOLVE_DEST:      return "RESOLVE_DEST";
        case RESOURCE_STATE_RESOLVE_SOURCE:    return "RESOLVE_SOURCE";
        case RESOURCE_STATE_INPUT_ATTACHMENT:  return "INPUT_ATTACHMENT";
        case RESOURCE_STATE_PRESENT:           return "PRESENT";
        case RESOURCE_STATE_BUILD_AS_READ:     return "BUILD_AS_READ";
        case RESOURCE_STATE_BUILD_AS_WRITE:    return "BUILD_AS_WRITE";
        case RESOURCE_STATE_RAY_TRACING:       return "RAY_TRACING";
        case RESOURCE_STATE_COMMON:            return "COMMON";
        case RESOURCE_STATE_SHADING_RATE:      return "SHADING_RATE";
        // clang-format on
        default:
            UNEXPECTED("Unknown resource state");
            return "UNKNOWN";
    }
}